

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QGraphicsItem_**>::relocate
          (QArrayDataPointer<QGraphicsItem_**> *this,qsizetype offset,QGraphicsItem ****data)

{
  QGraphicsItem ***d_first;
  QGraphicsItem ***pppQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QGraphicsItem**,long_long>(this->ptr,this->size,d_first);
  if (data != (QGraphicsItem ****)0x0) {
    pppQVar1 = *data;
    if ((this->ptr <= pppQVar1) && (pppQVar1 < this->ptr + this->size)) {
      *data = pppQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }